

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16781328,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char cVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong *puVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 bi;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 bi_1;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 ai_1;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 ai;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai_3;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar60._4_4_ = uVar1;
  auVar60._0_4_ = uVar1;
  auVar60._8_4_ = uVar1;
  auVar60._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar58._4_4_ = uVar1;
  auVar58._0_4_ = uVar1;
  auVar58._8_4_ = uVar1;
  auVar58._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar2 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar3 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar10 = fVar5 * 0.99999964;
  fVar11 = fVar6 * 0.99999964;
  fVar12 = fVar7 * 0.99999964;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  fVar7 = fVar7 * 1.0000004;
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar8 = (tray->tnear).field_0.i[k];
  auVar54._4_4_ = iVar8;
  auVar54._0_4_ = iVar8;
  auVar54._8_4_ = iVar8;
  auVar54._12_4_ = iVar8;
  iVar8 = (tray->tfar).field_0.i[k];
  auVar56._4_4_ = iVar8;
  auVar56._0_4_ = iVar8;
  auVar56._8_4_ = iVar8;
  auVar56._12_4_ = iVar8;
  puVar26 = local_7d0;
LAB_016136c1:
  puVar25 = puVar26;
  if (puVar25 == &local_7d8) {
LAB_01613bc2:
    return puVar25 != &local_7d8;
  }
  puVar26 = puVar25 + -1;
  uVar22 = puVar25[-1];
  do {
    fVar9 = *(float *)(ray + k * 4 + 0xe0);
    auVar28._4_4_ = fVar9;
    auVar28._0_4_ = fVar9;
    auVar28._8_4_ = fVar9;
    auVar28._12_4_ = fVar9;
    fVar13 = 1.0 - fVar9;
    auVar29._4_4_ = fVar13;
    auVar29._0_4_ = fVar13;
    auVar29._8_4_ = fVar13;
    auVar29._12_4_ = fVar13;
    do {
      if ((uVar22 & 8) != 0) {
        cVar18 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar22 & 0xfffffffffffffff0) * 0x40 + 0x28))
                           (pre,ray,k,context);
        if (cVar18 == '\0') goto LAB_016136c1;
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        goto LAB_01613bc2;
      }
      uVar20 = (uint)uVar22 & 7;
      uVar19 = uVar22 & 0xfffffffffffffff0;
      if (uVar20 == 3) {
        auVar33 = *(undefined1 (*) [16])(uVar19 + 0x80);
        auVar43 = *(undefined1 (*) [16])(uVar19 + 0x90);
        auVar34 = *(undefined1 (*) [16])(uVar19 + 0xa0);
        auVar53._0_4_ = fVar4 * auVar33._0_4_;
        auVar53._4_4_ = fVar4 * auVar33._4_4_;
        auVar53._8_4_ = fVar4 * auVar33._8_4_;
        auVar53._12_4_ = fVar4 * auVar33._12_4_;
        auVar55._0_4_ = fVar4 * auVar43._0_4_;
        auVar55._4_4_ = fVar4 * auVar43._4_4_;
        auVar55._8_4_ = fVar4 * auVar43._8_4_;
        auVar55._12_4_ = fVar4 * auVar43._12_4_;
        auVar15._4_4_ = uVar3;
        auVar15._0_4_ = uVar3;
        auVar15._8_4_ = uVar3;
        auVar15._12_4_ = uVar3;
        auVar38 = vfmadd231ps_fma(auVar53,auVar15,*(undefined1 (*) [16])(uVar19 + 0x50));
        auVar51 = vfmadd231ps_fma(auVar55,auVar15,*(undefined1 (*) [16])(uVar19 + 0x60));
        auVar16._4_4_ = uVar2;
        auVar16._0_4_ = uVar2;
        auVar16._8_4_ = uVar2;
        auVar16._12_4_ = uVar2;
        auVar31 = vfmadd231ps_fma(auVar38,auVar16,*(undefined1 (*) [16])(uVar19 + 0x20));
        auVar37 = vfmadd231ps_fma(auVar51,auVar16,*(undefined1 (*) [16])(uVar19 + 0x30));
        auVar57._8_4_ = 0x7fffffff;
        auVar57._0_8_ = 0x7fffffff7fffffff;
        auVar57._12_4_ = 0x7fffffff;
        auVar38 = vandps_avx(auVar31,auVar57);
        auVar47._8_4_ = 0x219392ef;
        auVar47._0_8_ = 0x219392ef219392ef;
        auVar47._12_4_ = 0x219392ef;
        auVar38 = vcmpps_avx(auVar38,auVar47,1);
        auVar51 = vblendvps_avx(auVar31,auVar47,auVar38);
        auVar38 = vandps_avx(auVar37,auVar57);
        auVar38 = vcmpps_avx(auVar38,auVar47,1);
        auVar31 = vblendvps_avx(auVar37,auVar47,auVar38);
        auVar59._0_4_ = auVar34._0_4_ * fVar4;
        auVar59._4_4_ = auVar34._4_4_ * fVar4;
        auVar59._8_4_ = auVar34._8_4_ * fVar4;
        auVar59._12_4_ = auVar34._12_4_ * fVar4;
        auVar38 = vfmadd231ps_fma(auVar59,auVar15,*(undefined1 (*) [16])(uVar19 + 0x70));
        auVar37 = vfmadd231ps_fma(auVar38,auVar16,*(undefined1 (*) [16])(uVar19 + 0x40));
        auVar38 = vandps_avx(auVar37,auVar57);
        auVar38 = vcmpps_avx(auVar38,auVar47,1);
        auVar38 = vblendvps_avx(auVar37,auVar47,auVar38);
        auVar37 = vrcpps_avx(auVar51);
        auVar30._8_4_ = 0x3f800000;
        auVar30._0_8_ = 0x3f8000003f800000;
        auVar30._12_4_ = 0x3f800000;
        auVar51 = vfnmadd213ps_fma(auVar51,auVar37,auVar30);
        auVar37 = vfmadd132ps_fma(auVar51,auVar37,auVar37);
        auVar51 = vrcpps_avx(auVar31);
        auVar31 = vfnmadd213ps_fma(auVar31,auVar51,auVar30);
        auVar15 = vfmadd132ps_fma(auVar31,auVar51,auVar51);
        auVar51 = vrcpps_avx(auVar38);
        auVar38 = vfnmadd213ps_fma(auVar38,auVar51,auVar30);
        auVar31._4_4_ = uVar1;
        auVar31._0_4_ = uVar1;
        auVar31._8_4_ = uVar1;
        auVar31._12_4_ = uVar1;
        auVar33 = vfmadd213ps_fma(auVar33,auVar31,*(undefined1 (*) [16])(uVar19 + 0xb0));
        auVar16 = vfmadd132ps_fma(auVar38,auVar51,auVar51);
        auVar38 = vfmadd231ps_fma(auVar33,auVar58,*(undefined1 (*) [16])(uVar19 + 0x50));
        auVar52._0_4_ = fVar9 * *(float *)(uVar19 + 0xe0);
        auVar52._4_4_ = fVar9 * *(float *)(uVar19 + 0xe4);
        auVar52._8_4_ = fVar9 * *(float *)(uVar19 + 0xe8);
        auVar52._12_4_ = fVar9 * *(float *)(uVar19 + 0xec);
        auVar33 = vfmadd213ps_fma(auVar43,auVar31,*(undefined1 (*) [16])(uVar19 + 0xc0));
        auVar43 = vfmadd213ps_fma(auVar34,auVar31,*(undefined1 (*) [16])(uVar19 + 0xd0));
        auVar33 = vfmadd231ps_fma(auVar33,auVar58,*(undefined1 (*) [16])(uVar19 + 0x60));
        auVar43 = vfmadd231ps_fma(auVar43,auVar58,*(undefined1 (*) [16])(uVar19 + 0x70));
        auVar51._0_4_ = fVar9 * *(float *)(uVar19 + 0xf0);
        auVar51._4_4_ = fVar9 * *(float *)(uVar19 + 0xf4);
        auVar51._8_4_ = fVar9 * *(float *)(uVar19 + 0xf8);
        auVar51._12_4_ = fVar9 * *(float *)(uVar19 + 0xfc);
        auVar34 = vfmadd231ps_fma(auVar38,auVar60,*(undefined1 (*) [16])(uVar19 + 0x20));
        auVar38 = vfmadd231ps_fma(auVar33,auVar60,*(undefined1 (*) [16])(uVar19 + 0x30));
        auVar48._0_4_ = fVar9 * *(float *)(uVar19 + 0x100);
        auVar48._4_4_ = fVar9 * *(float *)(uVar19 + 0x104);
        auVar48._8_4_ = fVar9 * *(float *)(uVar19 + 0x108);
        auVar48._12_4_ = fVar9 * *(float *)(uVar19 + 0x10c);
        auVar31 = ZEXT816(0) << 0x20;
        auVar33 = vfmadd231ps_fma(auVar52,auVar29,auVar31);
        auVar51 = vfmadd231ps_fma(auVar51,auVar29,auVar31);
        auVar31 = vfmadd231ps_fma(auVar48,auVar29,auVar31);
        auVar30 = vfmadd231ps_fma(auVar43,auVar60,*(undefined1 (*) [16])(uVar19 + 0x40));
        auVar43._0_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x110);
        auVar43._4_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x114);
        auVar43._8_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x118);
        auVar43._12_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x11c);
        auVar33 = vsubps_avx(auVar33,auVar34);
        auVar43 = vsubps_avx(auVar43,auVar34);
        auVar44._0_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x120);
        auVar44._4_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x124);
        auVar44._8_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x128);
        auVar44._12_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 300);
        auVar34 = vsubps_avx(auVar51,auVar38);
        auVar38 = vsubps_avx(auVar44,auVar38);
        auVar45._0_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x130);
        auVar45._4_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x134);
        auVar45._8_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x138);
        auVar45._12_4_ = fVar13 + fVar9 * *(float *)(uVar19 + 0x13c);
        auVar51 = vsubps_avx(auVar31,auVar30);
        auVar31 = vsubps_avx(auVar45,auVar30);
        auVar46._0_4_ = auVar37._0_4_ * auVar33._0_4_;
        auVar46._4_4_ = auVar37._4_4_ * auVar33._4_4_;
        auVar46._8_4_ = auVar37._8_4_ * auVar33._8_4_;
        auVar46._12_4_ = auVar37._12_4_ * auVar33._12_4_;
        auVar41._0_4_ = auVar37._0_4_ * auVar43._0_4_;
        auVar41._4_4_ = auVar37._4_4_ * auVar43._4_4_;
        auVar41._8_4_ = auVar37._8_4_ * auVar43._8_4_;
        auVar41._12_4_ = auVar37._12_4_ * auVar43._12_4_;
        auVar50._0_4_ = auVar34._0_4_ * auVar15._0_4_;
        auVar50._4_4_ = auVar34._4_4_ * auVar15._4_4_;
        auVar50._8_4_ = auVar34._8_4_ * auVar15._8_4_;
        auVar50._12_4_ = auVar34._12_4_ * auVar15._12_4_;
        auVar49._0_4_ = auVar16._0_4_ * auVar51._0_4_;
        auVar49._4_4_ = auVar16._4_4_ * auVar51._4_4_;
        auVar49._8_4_ = auVar16._8_4_ * auVar51._8_4_;
        auVar49._12_4_ = auVar16._12_4_ * auVar51._12_4_;
        auVar37._0_4_ = auVar15._0_4_ * auVar38._0_4_;
        auVar37._4_4_ = auVar15._4_4_ * auVar38._4_4_;
        auVar37._8_4_ = auVar15._8_4_ * auVar38._8_4_;
        auVar37._12_4_ = auVar15._12_4_ * auVar38._12_4_;
        auVar34._0_4_ = auVar16._0_4_ * auVar31._0_4_;
        auVar34._4_4_ = auVar16._4_4_ * auVar31._4_4_;
        auVar34._8_4_ = auVar16._8_4_ * auVar31._8_4_;
        auVar34._12_4_ = auVar16._12_4_ * auVar31._12_4_;
        auVar33 = vpminsd_avx(auVar50,auVar37);
        auVar43 = vpminsd_avx(auVar49,auVar34);
        auVar33 = vmaxps_avx(auVar33,auVar43);
        auVar51 = vpminsd_avx(auVar46,auVar41);
        auVar38 = vpmaxsd_avx(auVar46,auVar41);
        auVar43 = vpmaxsd_avx(auVar50,auVar37);
        auVar34 = vpmaxsd_avx(auVar49,auVar34);
        auVar34 = vminps_avx(auVar43,auVar34);
        auVar43 = vmaxps_avx(auVar54,auVar51);
        auVar33 = vmaxps_avx(auVar43,auVar33);
        auVar43 = vminps_avx(auVar56,auVar38);
        auVar43 = vminps_avx(auVar43,auVar34);
        auVar38._0_4_ = auVar33._0_4_ * 0.99999964;
        auVar38._4_4_ = auVar33._4_4_ * 0.99999964;
        auVar38._8_4_ = auVar33._8_4_ * 0.99999964;
        auVar38._12_4_ = auVar33._12_4_ * 0.99999964;
        auVar33._0_4_ = auVar43._0_4_ * 1.0000004;
        auVar33._4_4_ = auVar43._4_4_ * 1.0000004;
        auVar33._8_4_ = auVar43._8_4_ * 1.0000004;
        auVar33._12_4_ = auVar43._12_4_ * 1.0000004;
        auVar33 = vcmpps_avx(auVar38,auVar33,2);
      }
      else {
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar23),auVar28,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + uVar23));
        auVar33 = vsubps_avx(auVar33,auVar60);
        auVar32._0_4_ = fVar10 * auVar33._0_4_;
        auVar32._4_4_ = fVar10 * auVar33._4_4_;
        auVar32._8_4_ = fVar10 * auVar33._8_4_;
        auVar32._12_4_ = fVar10 * auVar33._12_4_;
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar27),auVar28,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + uVar27));
        auVar33 = vsubps_avx(auVar33,auVar58);
        auVar35._0_4_ = fVar11 * auVar33._0_4_;
        auVar35._4_4_ = fVar11 * auVar33._4_4_;
        auVar35._8_4_ = fVar11 * auVar33._8_4_;
        auVar35._12_4_ = fVar11 * auVar33._12_4_;
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar24),auVar28,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + uVar24));
        auVar17._4_4_ = uVar1;
        auVar17._0_4_ = uVar1;
        auVar17._8_4_ = uVar1;
        auVar17._12_4_ = uVar1;
        auVar33 = vsubps_avx(auVar33,auVar17);
        auVar39._0_4_ = fVar12 * auVar33._0_4_;
        auVar39._4_4_ = fVar12 * auVar33._4_4_;
        auVar39._8_4_ = fVar12 * auVar33._8_4_;
        auVar39._12_4_ = fVar12 * auVar33._12_4_;
        auVar33 = vmaxps_avx(auVar35,auVar39);
        auVar43 = vmaxps_avx(auVar54,auVar32);
        auVar33 = vmaxps_avx(auVar43,auVar33);
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar23 ^ 0x10)),auVar28,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar23 ^ 0x10)));
        auVar43 = vsubps_avx(auVar43,auVar60);
        auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar27 ^ 0x10)),auVar28,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar27 ^ 0x10)));
        auVar36._0_4_ = fVar5 * auVar43._0_4_;
        auVar36._4_4_ = fVar5 * auVar43._4_4_;
        auVar36._8_4_ = fVar5 * auVar43._8_4_;
        auVar36._12_4_ = fVar5 * auVar43._12_4_;
        auVar43 = vsubps_avx(auVar34,auVar58);
        auVar40._0_4_ = fVar6 * auVar43._0_4_;
        auVar40._4_4_ = fVar6 * auVar43._4_4_;
        auVar40._8_4_ = fVar6 * auVar43._8_4_;
        auVar40._12_4_ = fVar6 * auVar43._12_4_;
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar24 ^ 0x10)),auVar28,
                                  *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar24 ^ 0x10)));
        auVar43 = vsubps_avx(auVar43,auVar17);
        auVar42._0_4_ = fVar7 * auVar43._0_4_;
        auVar42._4_4_ = fVar7 * auVar43._4_4_;
        auVar42._8_4_ = fVar7 * auVar43._8_4_;
        auVar42._12_4_ = fVar7 * auVar43._12_4_;
        auVar43 = vminps_avx(auVar40,auVar42);
        auVar34 = vminps_avx(auVar56,auVar36);
        auVar43 = vminps_avx(auVar34,auVar43);
        auVar33 = vcmpps_avx(auVar33,auVar43,2);
        if (uVar20 == 6) {
          auVar43 = vcmpps_avx(*(undefined1 (*) [16])(uVar19 + 0xe0),auVar28,2);
          auVar34 = vcmpps_avx(auVar28,*(undefined1 (*) [16])(uVar19 + 0xf0),1);
          auVar43 = vandps_avx(auVar43,auVar34);
          auVar33 = vandps_avx(auVar43,auVar33);
        }
      }
      auVar33 = vpslld_avx(auVar33,0x1f);
      uVar20 = vmovmskps_avx(auVar33);
      if (uVar20 == 0) goto LAB_016136c1;
      uVar20 = uVar20 & 0xff;
      lVar14 = 0;
      for (uVar22 = (ulong)uVar20; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar14 = lVar14 + 1;
      }
      uVar22 = *(ulong *)(uVar19 + lVar14 * 8);
      uVar20 = uVar20 - 1 & uVar20;
      uVar21 = (ulong)uVar20;
    } while (uVar20 == 0);
    do {
      *puVar26 = uVar22;
      puVar26 = puVar26 + 1;
      lVar14 = 0;
      for (uVar22 = uVar21; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar14 = lVar14 + 1;
      }
      uVar21 = uVar21 - 1 & uVar21;
      uVar22 = *(ulong *)(uVar19 + lVar14 * 8);
    } while (uVar21 != 0);
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }